

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O3

bool32 rw::d3d::rasterFromImage(Raster *raster,Image *image)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int32 depth;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint8 *puVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  uint8 *puVar11;
  uint8 *puVar12;
  code *pcVar13;
  Image *local_58;
  
  if ((raster->type & 0xfU) != 4) {
    return 0;
  }
  depth = image->depth;
  if ((depth < 9) && (isP8supported == 0)) {
    local_58 = Image::create(image->width,image->height,depth);
    local_58->stride = image->stride;
    puVar8 = image->palette;
    local_58->pixels = image->pixels;
    local_58->palette = puVar8;
    Image::unpalettize(local_58,false);
    depth = local_58->depth;
    image = local_58;
  }
  else {
    local_58 = (Image *)0x0;
  }
  uVar1 = raster->format;
  uVar6 = uVar1 & 0x6f00;
  uVar3 = depth << 0x1e | depth - 4U >> 2;
  if (7 < uVar3) goto switchD_00116b48_caseD_2;
  lVar5 = (long)nativeRasterOffset;
  switch(uVar3) {
  case 0:
    pcVar13 = conv_8_from_8;
    if ((uVar6 != 0x2500) && (uVar6 != 0x4500)) break;
    goto LAB_00116bc5;
  case 1:
    if (uVar6 == 0x2500) {
      pcVar13 = conv_8_from_8;
      goto LAB_00116bc5;
    }
    break;
  case 3:
    if (uVar6 == 0x100) {
      pcVar13 = conv_ARGB1555_from_ARGB1555;
      goto LAB_00116bc5;
    }
    break;
  case 5:
    if (uVar6 == 0x500) {
      pcVar13 = conv_BGRA8888_from_RGB888;
      goto LAB_00116bc5;
    }
    goto LAB_00116b94;
  case 7:
    if (uVar6 == 0x500) {
      pcVar13 = conv_BGRA8888_from_RGBA8888;
      goto LAB_00116bc5;
    }
LAB_00116b94:
    if (uVar6 == 0x600) {
      pcVar13 = conv_BGR888_from_RGB888;
LAB_00116bc5:
      iVar4 = 0x10;
      if (((uVar1 >> 0xe & 1) != 0) || (iVar4 = 0x100, (uVar1 >> 0xd & 1) != 0)) {
        puVar8 = image->palette;
        puVar11 = *(uint8 **)((long)&raster->flags + lVar5);
        do {
          conv_RGBA8888_from_RGBA8888(puVar11,puVar8);
          puVar8 = puVar8 + 4;
          puVar11 = puVar11 + 4;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      puVar8 = raster->pixels;
      if (puVar8 == (uint8 *)0x0) {
        Raster::lock(raster,0,5);
      }
      iVar4 = image->height;
      if (0 < iVar4) {
        puVar11 = image->pixels;
        puVar10 = raster->pixels;
        iVar2 = image->width;
        iVar7 = 0;
        do {
          if (0 < iVar2) {
            iVar4 = 0;
            puVar9 = puVar10;
            puVar12 = puVar11;
            do {
              (*pcVar13)(puVar9,puVar12);
              puVar12 = puVar12 + image->bpp;
              puVar9 = puVar9 + *(uint *)((long)&raster->depth + lVar5);
              iVar4 = iVar4 + 1;
              iVar2 = image->width;
            } while (iVar4 < iVar2);
            iVar4 = image->height;
          }
          puVar11 = puVar11 + image->stride;
          puVar10 = puVar10 + raster->stride;
          iVar7 = iVar7 + 1;
        } while (iVar7 < iVar4);
      }
      if (puVar8 == (uint8 *)0x0) {
        Raster::unlock(raster,0);
      }
      if (local_58 == (Image *)0x0) {
        return 1;
      }
      Image::destroy(local_58);
      return 1;
    }
  }
switchD_00116b48_caseD_2:
  rasterFromImage();
  return 0;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	if((raster->type&0xF) != Raster::TEXTURE)
		return 0;

	void (*conv)(uint8 *out, uint8 *in) = nil;

	// Unpalettize image if necessary but don't change original
	Image *truecolimg = nil;
	if(image->depth <= 8 && !isP8supported){
		truecolimg = Image::create(image->width, image->height, image->depth);
		truecolimg->pixels = image->pixels;
		truecolimg->stride = image->stride;
		truecolimg->palette = image->palette;
		truecolimg->unpalettize();
		image = truecolimg;
	}

	D3dRaster *natras = GETD3DRASTEREXT(raster);
	int32 format = raster->format&(Raster::PAL8 | Raster::PAL4 | 0xF00);
	switch(image->depth){
	case 32:
		if(format == Raster::C8888)
			conv = conv_BGRA8888_from_RGBA8888;
		else if(format == Raster::C888)
			conv = conv_BGR888_from_RGB888;
		else
			goto err;
		break;
	case 24:
		if(format == Raster::C8888)
			conv = conv_BGRA8888_from_RGB888;
		else if(format == Raster::C888)
			conv = conv_BGR888_from_RGB888;
		else
			goto err;
		break;
	case 16:
		if(format == Raster::C1555)
			conv = conv_ARGB1555_from_ARGB1555;
		else
			goto err;
		break;
	case 8:
		if(format == (Raster::PAL8 | Raster::C8888))
			conv = conv_8_from_8;
		else
			goto err;
		break;
	case 4:
		if(format == (Raster::PAL4 | Raster::C8888) ||
		   format == (Raster::PAL8 | Raster::C8888))
			conv = conv_8_from_8;
		else
			goto err;
		break;
	default:
	err:
fprintf(stderr, "%d %x\n", image->depth, format); fflush(stdout);
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	uint8 *in, *out;
	int pallength = 0;
	if(raster->format & Raster::PAL4)
		pallength = 16;
	else if(raster->format & Raster::PAL8)
		pallength = 256;
	if(pallength){
		in = image->palette;
		out = (uint8*)natras->palette;
		for(int32 i = 0; i < pallength; i++){
			conv_RGBA8888_from_RGBA8888(out, in);
			in += 4;
			out += 4;
		}
	}

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		unlock = true;
	}

	uint8 *pixels = raster->pixels;
	assert(pixels);
	uint8 *imgpixels = image->pixels;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(rasrow, imgrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels += image->stride;
		pixels += raster->stride;
	}
	if(unlock)
		raster->unlock(0);

	if(truecolimg)
		truecolimg->destroy();

	return 1;
}